

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O0

ngx_int_t ngx_http_variable_is_args
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  uintptr_t data_local;
  ngx_http_variable_value_t *v_local;
  ngx_http_request_t *r_local;
  
  *(uint *)v = *(uint *)v & 0xefffffff | 0x10000000;
  *(uint *)v = *(uint *)v & 0xdfffffff;
  *(uint *)v = *(uint *)v & 0xbfffffff;
  if ((r->args).len == 0) {
    *(uint *)v = *(uint *)v & 0xf0000000;
    v->data = (u_char *)0x0;
  }
  else {
    *(uint *)v = *(uint *)v & 0xf0000000 | 1;
    v->data = (u_char *)"?";
  }
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_variable_is_args(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    v->valid = 1;
    v->no_cacheable = 0;
    v->not_found = 0;

    if (r->args.len == 0) {
        v->len = 0;
        v->data = NULL;
        return NGX_OK;
    }

    v->len = 1;
    v->data = (u_char *) "?";

    return NGX_OK;
}